

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O0

void __thiscall
myvk::CommandBuffer::CmdCopy
          (CommandBuffer *this,Ptr<ImageBase> *src,Ptr<ImageBase> *dst,
          vector<VkImageCopy,_std::allocator<VkImageCopy>_> *regions,VkImageLayout src_layout,
          VkImageLayout dst_layout)

{
  VkCommandBuffer pVVar1;
  PFN_vkCmdCopyImage p_Var2;
  element_type *peVar3;
  VkImage pVVar4;
  VkImage pVVar5;
  size_type sVar6;
  VkImageCopy *pVVar7;
  vector<VkImageCopy,_std::allocator<VkImageCopy>_> *in_RCX;
  long in_RDI;
  VkImageLayout in_R8D;
  VkImageLayout in_R9D;
  
  p_Var2 = vkCmdCopyImage;
  pVVar1 = *(VkCommandBuffer *)(in_RDI + 0x28);
  peVar3 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2accc9);
  pVVar4 = ImageBase::GetHandle(peVar3);
  peVar3 = std::__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::ImageBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x2acce8);
  pVVar5 = ImageBase::GetHandle(peVar3);
  sVar6 = std::vector<VkImageCopy,_std::allocator<VkImageCopy>_>::size(in_RCX);
  pVVar7 = std::vector<VkImageCopy,_std::allocator<VkImageCopy>_>::data
                     ((vector<VkImageCopy,_std::allocator<VkImageCopy>_> *)0x2acd15);
  (*p_Var2)(pVVar1,pVVar4,in_R8D,pVVar5,in_R9D,(uint32_t)sVar6,pVVar7);
  return;
}

Assistant:

void CommandBuffer::CmdCopy(const Ptr<ImageBase> &src, const Ptr<ImageBase> &dst,
                            const std::vector<VkImageCopy> &regions, VkImageLayout src_layout,
                            VkImageLayout dst_layout) const {
	vkCmdCopyImage(m_command_buffer, src->GetHandle(), src_layout, dst->GetHandle(), dst_layout, regions.size(),
	               regions.data());
}